

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::vector<unsigned_long,false>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  long lVar4;
  vector<unsigned_long,_false> vec;
  void *local_58;
  iterator iStack_50;
  unsigned_long *local_48;
  unsigned_long local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ).
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ).
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ).
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    lVar3 = 0;
    do {
      local_58 = (void *)0x0;
      iStack_50._M_current = (unsigned_long *)0x0;
      local_48 = (unsigned_long *)0x0;
      iVar2 = (*this->_vptr_Deserializer[8])(this);
      for (lVar4 = CONCAT44(extraout_var_00,iVar2); lVar4 != 0; lVar4 = lVar4 + -1) {
        iVar2 = (*this->_vptr_Deserializer[0x15])(this);
        local_38 = CONCAT44(extraout_var_01,iVar2);
        if (iStack_50._M_current == local_48) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,iStack_50,
                     &local_38);
        }
        else {
          *iStack_50._M_current = local_38;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
      }
      (*this->_vptr_Deserializer[9])(this);
      ::std::
      vector<duckdb::vector<unsigned_long,false>,std::allocator<duckdb::vector<unsigned_long,false>>>
      ::emplace_back<duckdb::vector<unsigned_long,false>>
                ((vector<duckdb::vector<unsigned_long,false>,std::allocator<duckdb::vector<unsigned_long,false>>>
                  *)__return_storage_ptr__,(vector<unsigned_long,_false> *)&local_58);
      if (local_58 != (void *)0x0) {
        operator_delete(local_58);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != CONCAT44(extraout_var,iVar1));
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}